

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

SolverOption * __thiscall
mp::SolverOptionManager::FindOption(SolverOptionManager *this,char *name,bool wildcardvalues)

{
  SolverOption *pSVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  ulong uVar6;
  _Base_ptr p_Var7;
  pointer pbVar8;
  undefined7 in_register_00000011;
  pointer pbVar9;
  SolverOption *this_00;
  long lVar10;
  pointer pbVar11;
  string name_str;
  DummyOption option;
  allocator<char> local_161;
  pointer local_160;
  undefined4 local_154;
  char *local_150;
  _Base_ptr local_148;
  string local_140;
  SolverOption *local_120 [2];
  undefined1 local_110 [224];
  
  local_154 = (undefined4)CONCAT71(in_register_00000011,wildcardvalues);
  local_150 = name;
  SolverOption::SolverOption
            ((SolverOption *)(local_110 + 0x10),name,"",(ValueArrayRef)ZEXT816(0),false);
  local_110._16_8_ = &PTR__SolverOption_005d4768;
  local_120[0] = (SolverOption *)(local_110 + 0x10);
  cVar5 = std::
          _Rb_tree<mp::SolverOption_*,_mp::SolverOption_*,_std::_Identity<mp::SolverOption_*>,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
          ::find(&(this->options_)._M_t,local_120);
  if ((_Rb_tree_header *)cVar5._M_node == &(this->options_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,local_150,(allocator<char> *)&local_140);
    p_Var7 = (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var7 != cVar5._M_node) {
      do {
        local_148 = cVar5._M_node;
        pSVar1 = local_120[0];
        this_00 = *(SolverOption **)(p_Var7 + 1);
        pbVar9 = (this_00->inline_synonyms_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (this_00->inline_synonyms_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar6 = (long)pbVar8 - (long)pbVar9;
        if (0 < (long)uVar6 >> 7) {
          pbVar11 = (pointer)((long)&(pbVar9->_M_dataplus)._M_p + (uVar6 & 0xffffffffffffff80));
          lVar10 = ((long)uVar6 >> 7) + 1;
          pbVar9 = pbVar9 + 2;
          local_160 = pbVar8;
          do {
            iVar4 = strcasecmp((char *)pSVar1,pbVar9[-2]._M_dataplus._M_p);
            if (iVar4 == 0) {
              pbVar9 = pbVar9 + -2;
              pbVar8 = local_160;
              goto LAB_004659c5;
            }
            iVar4 = strcasecmp((char *)pSVar1,pbVar9[-1]._M_dataplus._M_p);
            if (iVar4 == 0) {
              pbVar9 = pbVar9 + -1;
              pbVar8 = local_160;
              goto LAB_004659c5;
            }
            iVar4 = strcasecmp((char *)pSVar1,(pbVar9->_M_dataplus)._M_p);
            pbVar8 = local_160;
            if (iVar4 == 0) goto LAB_004659c5;
            iVar4 = strcasecmp((char *)pSVar1,pbVar9[1]._M_dataplus._M_p);
            pbVar8 = local_160;
            if (iVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              goto LAB_004659c5;
            }
            lVar10 = lVar10 + -1;
            pbVar9 = pbVar9 + 4;
          } while (1 < lVar10);
          uVar6 = (long)local_160 - (long)pbVar11;
          pbVar9 = pbVar11;
        }
        lVar10 = (long)uVar6 >> 5;
        if (lVar10 == 1) {
LAB_004659a6:
          iVar4 = strcasecmp((char *)pSVar1,(pbVar9->_M_dataplus)._M_p);
          if (iVar4 != 0) {
            pbVar9 = pbVar8;
          }
LAB_004659c5:
          if (pbVar9 != pbVar8) goto LAB_00465a32;
        }
        else {
          if (lVar10 == 2) {
LAB_0046598e:
            iVar4 = strcasecmp((char *)pSVar1,(pbVar9->_M_dataplus)._M_p);
            if (iVar4 != 0) {
              pbVar9 = pbVar9 + 1;
              goto LAB_004659a6;
            }
            goto LAB_004659c5;
          }
          if (lVar10 == 3) {
            iVar4 = strcasecmp((char *)pSVar1,(pbVar9->_M_dataplus)._M_p);
            if (iVar4 != 0) {
              pbVar9 = pbVar9 + 1;
              goto LAB_0046598e;
            }
            goto LAB_004659c5;
          }
        }
        p_Var2 = local_148;
        if ((char)local_154 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,local_150,&local_161);
          bVar3 = SolverOption::wc_match(this_00,&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) {
            this_00 = *(SolverOption **)(p_Var7 + 1);
            goto LAB_00465a32;
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        cVar5._M_node = local_148;
      } while (p_Var7 != p_Var2);
    }
    this_00 = (SolverOption *)0x0;
LAB_00465a32:
    if (local_120[0] != (SolverOption *)local_110) {
      operator_delete(local_120[0],local_110._0_8_ + 1);
    }
  }
  else {
    pSVar1 = *(SolverOption **)(cVar5._M_node + 1);
    this_00 = (SolverOption *)0x0;
    if ((char)local_154 == '\0') {
      this_00 = pSVar1;
    }
    if ((pSVar1->wc_headtails_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pSVar1->wc_headtails_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = pSVar1;
    }
  }
  SolverOption::~SolverOption((SolverOption *)(local_110 + 0x10));
  return this_00;
}

Assistant:

SolverOption *SolverOptionManager::FindOption(
    const char *name, bool wildcardvalues) const {
  struct DummyOption : SolverOption {
    DummyOption(const char *name) : SolverOption(name, "") {}
    void Write(fmt::Writer &) {}
    void Parse(const char *&, bool) {}
    Option_Type type() {
      return Option_Type::BOOL;
    }
  };
  DummyOption option(name);
  // find by name
  OptionSet::const_iterator i = options_.find(&option);
  if (i != options_.end()) {
    if ((*i)->is_wildcard() && wildcardvalues)
      return 0;
    return *i;
  }

  // find by inline synonyms and wildcards. Case-insensitive
  std::string name_str {name};
  for (OptionSet::const_iterator i = options_.begin();
    i != options_.end(); ++i)
  {
    if (std::find_if((*i)->inline_synonyms().begin(),
                    (*i)->inline_synonyms().end(),
                    [&name_str](const std::string& syn) {
                     return 0==strcasecmp(name_str.c_str(), syn.c_str()); } ) !=
        (*i)->inline_synonyms().end()) {
      return *i;
    }
    /// Wildcards
    if (wildcardvalues && (*i)->wc_match(name))
      return *i;
  }
  return 0;
}